

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int os_remove(lua_State *L)

{
  int iVar1;
  char *__filename;
  int *piVar2;
  char *pcVar3;
  StkId pTVar4;
  int iVar5;
  
  iVar5 = 1;
  __filename = luaL_checklstring(L,1,(size_t *)0x0);
  iVar1 = remove(__filename);
  if (iVar1 == 0) {
    pTVar4 = L->top;
    (pTVar4->value).b = 1;
  }
  else {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    pTVar4 = L->top;
    pTVar4->tt = 0;
    L->top = pTVar4 + 1;
    pcVar3 = strerror(iVar1);
    lua_pushfstring(L,"%s: %s",__filename,pcVar3);
    pTVar4 = L->top;
    (pTVar4->value).n = (double)iVar1;
    iVar5 = 3;
  }
  pTVar4->tt = iVar5;
  L->top = L->top + 1;
  return iVar5;
}

Assistant:

static int os_remove(lua_State*L){
const char*filename=luaL_checkstring(L,1);
return os_pushresult(L,remove(filename)==0,filename);
}